

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  ostream *poVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  float fVar6;
  float fVar7;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  double local_a0;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  Scalar local_68;
  Scalar local_60;
  double local_58;
  double local_50;
  Scalar local_48;
  Scalar local_40;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38;
  
  local_38.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(local_38.m_xpr._4_4_,3);
  local_a0 = (double)CONCAT44(local_a0._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&local_38,
             (int *)&local_a0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,0);
  fVar6 = (float)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,1);
  fVar7 = (float)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,2);
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,3);
  fVar9 = fVar6 * fVar6 + fVar7 * fVar7;
  if (0.0001 <= ABS(fVar9)) {
    dVar2 = *pdVar3;
    fVar8 = SQRT(fVar9);
    local_38.m_row = 0;
    local_38.m_col = 1;
    local_38.m_currentBlockRows = 1;
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = (double)(fVar6 / fVar8);
    local_a0 = (double)(fVar7 / fVar8);
    local_38.m_xpr = __return_storage_ptr__;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_38,&local_a0);
    local_40 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_40);
    local_48 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_98 = -fVar7;
    uStack_94 = extraout_XMM0_Db ^ 0x80000000;
    uStack_90 = extraout_XMM0_Dc ^ 0x80000000;
    uStack_8c = extraout_XMM0_Dd ^ 0x80000000;
    local_50 = (double)(local_98 / fVar9);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_58 = (double)(fVar6 / fVar9);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    local_68 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    local_70 = (double)((((float)dVar1 * fVar7 - (float)dVar2 * fVar6) * fVar7) / (fVar9 * fVar8));
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_78 = (double)((((float)dVar2 * fVar6 + local_98 * (float)dVar1) * fVar6) / (fVar9 * fVar8)
                       );
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = (double)(fVar6 / fVar8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_80);
    local_88 = (double)(fVar7 / fVar8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_88);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_38)
    ;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"CalculateJacobian () - Error - Division by Zero"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
  /**
  TODO:
    * Calculate a Jacobian here.
  */
  MatrixXd Hj(3, 4);
  //recover state parameters
  float px = x_state(0);
  float py = x_state(1);
  float vx = x_state(2);
  float vy = x_state(3);

  //pre-compute a set of terms to avoid repeated calculation
  float c1 = px*px + py*py;
  float c2 = sqrt(c1);
  float c3 = (c1*c2);

  //check division by zero
  if (fabs(c1) < 0.0001){
      std::cout << "CalculateJacobian () - Error - Division by Zero" << std::endl;
      return Hj;
  }

  //compute the Jacobian matrix
  Hj << (px / c2), (py / c2), 0, 0,
      -(py / c1), (px / c1), 0, 0,
      py*(vx*py - vy*px) / c3, px*(px*vy - py*vx) / c3, px / c2, py / c2;

  return Hj;
}